

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

size_t __thiscall
edition_unittest::TestCamelCaseFieldNames::ByteSizeLong(TestCamelCaseFieldNames *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int32_t value;
  ForeignEnum value_00;
  RepeatedField<int> *pRVar4;
  size_t sVar5;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar6;
  const_reference pbVar7;
  RepeatedPtrField<edition_unittest::ForeignMessage> *this_00;
  reference value_01;
  uint32_t *puVar8;
  string *value_02;
  string_view sVar9;
  string_view value_03;
  WireFormatLite *local_b8;
  WireFormatLite *local_a8;
  int local_94;
  int n_2;
  int i_2;
  int n_1;
  int i_1;
  ForeignMessage *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<edition_unittest::ForeignMessage> *__range2;
  int local_60;
  int n;
  int i;
  uint32_t cached_has_bits;
  size_t total_size;
  TestCamelCaseFieldNames *this_;
  TestCamelCaseFieldNames *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  pRVar4 = _internal_repeatedprimitivefield(this);
  sVar5 = google::protobuf::internal::WireFormatLite::Int32SizeWithPackedTagSize
                    (pRVar4,1,&(this->field_0)._impl_._repeatedprimitivefield_cached_byte_size_);
  pRVar6 = _internal_repeatedstringfield_abi_cxx11_(this);
  iVar3 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar6);
  _i = google::protobuf::internal::FromIntSize(iVar3);
  _i = _i + sVar5;
  local_60 = 0;
  pRVar6 = _internal_repeatedstringfield_abi_cxx11_(this);
  iVar3 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar6);
  for (; local_60 < iVar3; local_60 = local_60 + 1) {
    pRVar6 = _internal_repeatedstringfield_abi_cxx11_(this);
    pbVar7 = google::protobuf::
             RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::Get(pRVar6,local_60);
    sVar5 = google::protobuf::internal::WireFormatLite::StringSize(pbVar7);
    _i = sVar5 + _i;
  }
  pRVar4 = _internal_repeatedenumfield(this);
  sVar5 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                    (pRVar4,1,&(this->field_0)._impl_._repeatedenumfield_cached_byte_size_);
  iVar3 = _internal_repeatedmessagefield_size(this);
  _i = (long)iVar3 + sVar5 + _i;
  this_00 = _internal_repeatedmessagefield(this);
  __end2 = google::protobuf::RepeatedPtrField<edition_unittest::ForeignMessage>::begin(this_00);
  msg = (ForeignMessage *)
        google::protobuf::RepeatedPtrField<edition_unittest::ForeignMessage>::end(this_00);
  while (bVar2 = google::protobuf::internal::operator!=(&__end2,(iterator *)&msg), bVar2) {
    value_01 = google::protobuf::internal::
               RepeatedPtrIterator<const_edition_unittest::ForeignMessage>::operator*(&__end2);
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSize<edition_unittest::ForeignMessage>(value_01);
    _i = sVar5 + _i;
    google::protobuf::internal::RepeatedPtrIterator<const_edition_unittest::ForeignMessage>::
    operator++(&__end2);
  }
  pRVar6 = _internal_repeatedstringpiecefield_abi_cxx11_(this);
  iVar3 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar6);
  sVar5 = google::protobuf::internal::FromIntSize(iVar3);
  _i = sVar5 + _i;
  i_2 = 0;
  pRVar6 = _internal_repeatedstringpiecefield_abi_cxx11_(this);
  iVar3 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar6);
  for (; i_2 < iVar3; i_2 = i_2 + 1) {
    pRVar6 = _internal_repeatedstringpiecefield_abi_cxx11_(this);
    pbVar7 = google::protobuf::
             RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::Get(pRVar6,i_2);
    sVar5 = google::protobuf::internal::WireFormatLite::StringSize(pbVar7);
    _i = sVar5 + _i;
  }
  pRVar6 = _internal_repeatedcordfield_abi_cxx11_(this);
  iVar3 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar6);
  sVar5 = google::protobuf::internal::FromIntSize(iVar3);
  _i = sVar5 + _i;
  local_94 = 0;
  pRVar6 = _internal_repeatedcordfield_abi_cxx11_(this);
  iVar3 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar6);
  for (; local_94 < iVar3; local_94 = local_94 + 1) {
    pRVar6 = _internal_repeatedcordfield_abi_cxx11_(this);
    pbVar7 = google::protobuf::
             RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::Get(pRVar6,local_94);
    sVar5 = google::protobuf::internal::WireFormatLite::StringSize(pbVar7);
    _i = sVar5 + _i;
  }
  puVar8 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar8;
  if ((uVar1 & 0x3f) != 0) {
    if ((uVar1 & 1) != 0) {
      sVar9 = _internal_stringfield(this);
      local_a8 = (WireFormatLite *)sVar9._M_len;
      sVar9._M_len = (size_t)sVar9._M_str;
      sVar5 = google::protobuf::internal::WireFormatLite::StringSize(local_a8,sVar9);
      _i = sVar5 + 1 + _i;
    }
    if ((uVar1 & 2) != 0) {
      sVar9 = _internal_stringpiecefield(this);
      value_03._M_str = sVar9._M_str;
      local_b8 = (WireFormatLite *)sVar9._M_len;
      value_03._M_len = (size_t)value_03._M_str;
      sVar5 = google::protobuf::internal::WireFormatLite::StringSize(local_b8,value_03);
      _i = sVar5 + 1 + _i;
    }
    if ((uVar1 & 4) != 0) {
      value_02 = _internal_cordfield_abi_cxx11_(this);
      sVar5 = google::protobuf::internal::WireFormatLite::StringSize(value_02);
      _i = sVar5 + 1 + _i;
    }
    if ((uVar1 & 8) != 0) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSize<edition_unittest::ForeignMessage>((this->field_0)._impl_.messagefield_);
      _i = sVar5 + 1 + _i;
    }
    if ((uVar1 & 0x10) != 0) {
      value = _internal_primitivefield(this);
      sVar5 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(value);
      _i = sVar5 + _i;
    }
    if ((uVar1 & 0x20) != 0) {
      value_00 = _internal_enumfield(this);
      sVar5 = google::protobuf::internal::WireFormatLite::EnumSize(value_00);
      _i = sVar5 + 1 + _i;
    }
  }
  sVar5 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,_i,&(this->field_0)._impl_._cached_size_);
  return sVar5;
}

Assistant:

::size_t TestCamelCaseFieldNames::ByteSizeLong() const {
  const TestCamelCaseFieldNames& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.TestCamelCaseFieldNames)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated int32 RepeatedPrimitiveField = 7;
    {
      total_size +=
          ::_pbi::WireFormatLite::Int32SizeWithPackedTagSize(
              this_._internal_repeatedprimitivefield(), 1,
              this_._impl_._repeatedprimitivefield_cached_byte_size_);
    }
    // repeated string RepeatedStringField = 8;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_repeatedstringfield().size());
      for (int i = 0, n = this_._internal_repeatedstringfield().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeatedstringfield().Get(i));
      }
    }
    // repeated .edition_unittest.ForeignEnum RepeatedEnumField = 9;
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_repeatedenumfield(), 1, this_._impl_._repeatedenumfield_cached_byte_size_);
    }
    // repeated .edition_unittest.ForeignMessage RepeatedMessageField = 10;
    {
      total_size += 1UL * this_._internal_repeatedmessagefield_size();
      for (const auto& msg : this_._internal_repeatedmessagefield()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated string RepeatedStringPieceField = 11 [ctype = STRING_PIECE];
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_repeatedstringpiecefield().size());
      for (int i = 0, n = this_._internal_repeatedstringpiecefield().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeatedstringpiecefield().Get(i));
      }
    }
    // repeated string RepeatedCordField = 12 [ctype = CORD];
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_repeatedcordfield().size());
      for (int i = 0, n = this_._internal_repeatedcordfield().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeatedcordfield().Get(i));
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    // string StringField = 2;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_stringfield());
    }
    // string StringPieceField = 5 [ctype = STRING_PIECE];
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_stringpiecefield());
    }
    // string CordField = 6 [ctype = CORD];
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_cordfield());
    }
    // .edition_unittest.ForeignMessage MessageField = 4;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.messagefield_);
    }
    // int32 PrimitiveField = 1;
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_primitivefield());
    }
    // .edition_unittest.ForeignEnum EnumField = 3;
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_enumfield());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}